

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

Page * pager_alloc_page(Pager *pPager,pgno num_page)

{
  Page *pSrc;
  
  pSrc = (Page *)SyMemBackendPoolAlloc(pPager->pAllocator,pPager->iPageSize + 0x68);
  if (pSrc != (Page *)0x0) {
    SyZero(pSrc,pPager->iPageSize + 0x68);
    pSrc->zData = (uchar *)(pSrc + 1);
    pSrc->pPager = pPager;
    pSrc->nRef = 1;
    pSrc->pgno = num_page;
  }
  return pSrc;
}

Assistant:

static Page * pager_alloc_page(Pager *pPager,pgno num_page)
{
	Page *pNew;
	
	pNew = (Page *)SyMemBackendPoolAlloc(pPager->pAllocator,sizeof(Page)+pPager->iPageSize);
	if( pNew == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pNew,sizeof(Page)+pPager->iPageSize);
	/* Page data */
	pNew->zData = (unsigned char *)&pNew[1];
	/* Fill in the structure */
	pNew->pPager = pPager;
	pNew->nRef = 1;
	pNew->pgno = num_page;
	return pNew;
}